

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fUniformLocationTests.cpp
# Opt level: O2

int __thiscall
deqp::gles31::Functional::UniformLocationTests::init(UniformLocationTests *this,EVP_PKEY_CTX *ctx)

{
  StructList *this_00;
  uint uVar1;
  TestContext *pTVar2;
  RenderContext *pRVar3;
  Context *pCVar4;
  undefined8 uVar5;
  value_type this_01;
  int ndx;
  int iVar6;
  deUint32 dVar7;
  int iVar8;
  ShaderStage SVar9;
  ShaderStage SVar10;
  ShaderStage SVar11;
  ShaderStage SVar12;
  ShaderStage SVar13;
  ShaderStage SVar14;
  ShaderStage SVar15;
  ShaderStage SVar16;
  ShaderStage SVar17;
  ShaderStage SVar18;
  ShaderStage SVar19;
  int extraout_EAX;
  TestNode *pTVar20;
  char *pcVar21;
  UniformLocationCase *pUVar22;
  long lVar23;
  StructType *pSVar24;
  pointer pUVar25;
  TestCaseGroup *pTVar26;
  int ndx_1;
  long lVar27;
  DataType DVar28;
  int iVar29;
  bool bVar30;
  undefined8 *local_238;
  UniformInfo uniform;
  vector<deqp::gles31::Functional::(anonymous_namespace)::UniformInfo,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::UniformInfo>_>
  config;
  value_type local_1e0 [2];
  TestNode *local_1d0;
  Random rng;
  Random rng_1;
  string name;
  Random rng_2;
  VarType local_120;
  VarType local_108;
  VarType local_f0;
  VarType local_d8;
  VarType local_c0;
  VarType local_a8;
  VarType local_90;
  VarType local_78;
  VarType local_60;
  VarType local_48;
  
  iVar6 = tcu::CommandLine::getBaseSeed
                    (((this->super_TestCaseGroup).m_context)->m_testCtx->m_cmdLine);
  pTVar20 = (TestNode *)operator_new(0x70);
  tcu::TestCaseGroup::TestCaseGroup
            ((TestCaseGroup *)pTVar20,
             (this->super_TestCaseGroup).super_TestCaseGroup.super_TestNode.m_testCtx,"basic",
             "Location specified with use, single shader stage");
  deRandom_init(&rng.m_rnd,iVar6 + 0x1001);
  tcu::TestNode::addChild((TestNode *)this,pTVar20);
  for (lVar27 = 0; lVar27 != 0x1c; lVar27 = lVar27 + 1) {
    local_1d0 = (TestNode *)CONCAT44(local_1d0._4_4_,(&DAT_00828fc0)[lVar27]);
    local_238 = &DAT_00a14b00;
    lVar23 = 0;
    while( true ) {
      if (lVar23 == 8) break;
      DVar28 = (ShaderStage)local_1d0;
      pcVar21 = glu::getDataTypeName((ShaderStage)local_1d0);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&config,pcVar21,(allocator<char> *)&rng_1);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&uniform,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&config,
                     "_");
      std::operator+(&name,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           &uniform,(char *)*local_238);
      std::__cxx11::string::~string((string *)&uniform);
      std::__cxx11::string::~string((string *)&config);
      config.
      super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::UniformInfo,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::UniformInfo>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      config.
      super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::UniformInfo,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::UniformInfo>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      config.
      super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::UniformInfo,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::UniformInfo>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      createVarType(&local_120,DVar28);
      SVar9 = *(ShaderStage *)(&DAT_008296c8 + lVar23);
      dVar7 = deRandom_getUint32(&rng.m_rnd);
      glu::VarType::VarType(&uniform.type,&local_120);
      uniform.location = dVar7 & 0x3ff;
      uniform.declareLocation = SVar9;
      uniform.layoutLocation = SVar9;
      uniform.checkLocation = SVar9;
      glu::VarType::~VarType(&local_120);
      std::
      vector<deqp::gles31::Functional::(anonymous_namespace)::UniformInfo,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::UniformInfo>_>
      ::push_back(&config,&uniform);
      pUVar22 = (UniformLocationCase *)operator_new(0x90);
      anon_unknown_0::UniformLocationCase::UniformLocationCase
                (pUVar22,(this->super_TestCaseGroup).super_TestCaseGroup.super_TestNode.m_testCtx,
                 ((this->super_TestCaseGroup).m_context)->m_renderCtx,name._M_dataplus._M_p,
                 name._M_dataplus._M_p,&config);
      tcu::TestNode::addChild(pTVar20,(TestNode *)pUVar22);
      glu::VarType::~VarType(&uniform.type);
      std::
      vector<deqp::gles31::Functional::(anonymous_namespace)::UniformInfo,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::UniformInfo>_>
      ::~vector(&config);
      std::__cxx11::string::~string((string *)&name);
      lVar23 = lVar23 + 4;
      local_238 = local_238 + 1;
    }
  }
  pTVar20 = (TestNode *)operator_new(0x70);
  tcu::TestCaseGroup::TestCaseGroup
            ((TestCaseGroup *)pTVar20,
             (this->super_TestCaseGroup).super_TestCaseGroup.super_TestNode.m_testCtx,"array",
             "Array location specified with use, single shader stage");
  deRandom_init(&rng_1.m_rnd,iVar6 + 0x2001);
  tcu::TestNode::addChild((TestNode *)this,pTVar20);
  for (lVar27 = 0; lVar27 != 0x1c; lVar27 = lVar27 + 1) {
    local_238 = &DAT_00a14b00;
    lVar23 = 0;
    local_1d0 = (TestNode *)CONCAT44(local_1d0._4_4_,(&DAT_00828fc0)[lVar27]);
    DVar28 = (&DAT_00828fc0)[lVar27];
    while( true ) {
      if (lVar23 == 8) break;
      pcVar21 = glu::getDataTypeName(DVar28);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&config,pcVar21,(allocator<char> *)&rng);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&uniform,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&config,
                     "_");
      std::operator+(&name,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           &uniform,(char *)*local_238);
      std::__cxx11::string::~string((string *)&uniform);
      std::__cxx11::string::~string((string *)&config);
      config.
      super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::UniformInfo,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::UniformInfo>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      config.
      super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::UniformInfo,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::UniformInfo>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      config.
      super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::UniformInfo,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::UniformInfo>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      createVarType((VarType *)&rng,DVar28);
      glu::VarType::VarType(&local_48,(VarType *)&rng,8);
      SVar9 = *(ShaderStage *)(&DAT_008296c8 + lVar23);
      dVar7 = deRandom_getUint32(&rng_1.m_rnd);
      glu::VarType::VarType(&uniform.type,&local_48);
      uniform.location = dVar7 % 0x3f8;
      uniform.declareLocation = SVar9;
      uniform.layoutLocation = SVar9;
      uniform.checkLocation = SVar9;
      glu::VarType::~VarType(&local_48);
      glu::VarType::~VarType((VarType *)&rng);
      std::
      vector<deqp::gles31::Functional::(anonymous_namespace)::UniformInfo,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::UniformInfo>_>
      ::push_back(&config,&uniform);
      pUVar22 = (UniformLocationCase *)operator_new(0x90);
      anon_unknown_0::UniformLocationCase::UniformLocationCase
                (pUVar22,(this->super_TestCaseGroup).super_TestCaseGroup.super_TestNode.m_testCtx,
                 ((this->super_TestCaseGroup).m_context)->m_renderCtx,name._M_dataplus._M_p,
                 name._M_dataplus._M_p,&config);
      tcu::TestNode::addChild(pTVar20,(TestNode *)pUVar22);
      glu::VarType::~VarType(&uniform.type);
      std::
      vector<deqp::gles31::Functional::(anonymous_namespace)::UniformInfo,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::UniformInfo>_>
      ::~vector(&config);
      std::__cxx11::string::~string((string *)&name);
      lVar23 = lVar23 + 4;
      local_238 = local_238 + 1;
      DVar28 = (ShaderStage)local_1d0;
    }
  }
  pTVar20 = (TestNode *)operator_new(0x70);
  tcu::TestCaseGroup::TestCaseGroup
            ((TestCaseGroup *)pTVar20,
             (this->super_TestCaseGroup).super_TestCaseGroup.super_TestNode.m_testCtx,"nested_array"
             ,"Array location specified with use, single shader stage");
  deRandom_init(&rng_2.m_rnd,iVar6 + 0x3001);
  tcu::TestNode::addChild((TestNode *)this,pTVar20);
  for (lVar27 = 0; lVar27 != 0x1c; lVar27 = lVar27 + 1) {
    uVar1 = (&DAT_00828fc0)[lVar27];
    local_1d0 = (TestNode *)(ulong)uVar1;
    local_238 = &DAT_00a14b00;
    lVar23 = 0;
    while( true ) {
      if (lVar23 == 8) break;
      pcVar21 = glu::getDataTypeName((DataType)local_1d0);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&config,pcVar21,(allocator<char> *)&rng);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&uniform,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&config,
                     "_");
      std::operator+(&name,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           &uniform,(char *)*local_238);
      std::__cxx11::string::~string((string *)&uniform);
      std::__cxx11::string::~string((string *)&config);
      DVar28 = (DataType)local_1d0;
      iVar8 = glu::getDataTypeScalarSize(DVar28);
      bVar30 = 0x1d < uVar1 - 0x27;
      config.
      super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::UniformInfo,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::UniformInfo>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      config.
      super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::UniformInfo,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::UniformInfo>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      config.
      super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::UniformInfo,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::UniformInfo>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      createVarType((VarType *)&rng_1,DVar28);
      iVar29 = (uint)(iVar8 < 5 && bVar30) * 4 + 3;
      glu::VarType::VarType((VarType *)&rng,(VarType *)&rng_1,iVar29);
      glu::VarType::VarType(&local_60,(VarType *)&rng,iVar29);
      SVar9 = *(ShaderStage *)(&DAT_008296c8 + lVar23);
      iVar29 = 0x3ce;
      if (iVar8 >= 5 || !bVar30) {
        iVar29 = 0x3f6;
      }
      iVar29 = de::Random::getInt(&rng_2,0,iVar29);
      glu::VarType::VarType(&uniform.type,&local_60);
      uniform.declareLocation = SVar9;
      uniform.layoutLocation = SVar9;
      uniform.checkLocation = SVar9;
      uniform.location = iVar29;
      glu::VarType::~VarType(&local_60);
      glu::VarType::~VarType((VarType *)&rng);
      glu::VarType::~VarType((VarType *)&rng_1);
      std::
      vector<deqp::gles31::Functional::(anonymous_namespace)::UniformInfo,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::UniformInfo>_>
      ::push_back(&config,&uniform);
      pUVar22 = (UniformLocationCase *)operator_new(0x90);
      anon_unknown_0::UniformLocationCase::UniformLocationCase
                (pUVar22,(this->super_TestCaseGroup).super_TestCaseGroup.super_TestNode.m_testCtx,
                 ((this->super_TestCaseGroup).m_context)->m_renderCtx,name._M_dataplus._M_p,
                 name._M_dataplus._M_p,&config);
      tcu::TestNode::addChild(pTVar20,(TestNode *)pUVar22);
      glu::VarType::~VarType(&uniform.type);
      std::
      vector<deqp::gles31::Functional::(anonymous_namespace)::UniformInfo,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::UniformInfo>_>
      ::~vector(&config);
      std::__cxx11::string::~string((string *)&name);
      lVar23 = lVar23 + 4;
      local_238 = local_238 + 1;
    }
  }
  pTVar20 = (TestNode *)operator_new(0x70);
  tcu::TestCaseGroup::TestCaseGroup
            ((TestCaseGroup *)pTVar20,
             (this->super_TestCaseGroup).super_TestCaseGroup.super_TestNode.m_testCtx,"struct",
             "Struct location, random contents & declaration location");
  deRandom_init(&rng.m_rnd,iVar6 + 0x4001);
  tcu::TestNode::addChild((TestNode *)this,pTVar20);
  this_00 = &this->structTypes;
  rng_2.m_rnd.x = 0;
  while( true ) {
    if (0xf < (int)rng_2.m_rnd.x) break;
    de::toString<int>((string *)&uniform,(int *)&rng_2);
    std::operator+(&name,"case_",
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&uniform);
    std::__cxx11::string::~string((string *)&uniform);
    SVar9 = deRandom_getUint32(&rng.m_rnd);
    SVar10 = deRandom_getUint32(&rng.m_rnd);
    SVar11 = deRandom_getUint32(&rng.m_rnd);
    local_1d0 = (TestNode *)CONCAT44(local_1d0._4_4_,0xffffffff);
    if ((SVar9 & SHADERSTAGE_BOTH) != SHADERSTAGE_NONE) {
      dVar7 = deRandom_getUint32(&rng.m_rnd);
      local_1d0 = (TestNode *)CONCAT44(local_1d0._4_4_,dVar7 % 0x3fb);
    }
    pSVar24 = (StructType *)operator_new(0x38);
    glu::StructType::StructType(pSVar24,"S");
    rng_1.m_rnd._0_8_ = pSVar24;
    std::vector<glu::StructType_*,_std::allocator<glu::StructType_*>_>::push_back
              (this_00,(value_type *)&rng_1);
    uVar5 = rng_1.m_rnd._0_8_;
    dVar7 = deRandom_getUint32(&rng.m_rnd);
    createVarType(&uniform.type,(&DAT_00828fc0)[(ulong)dVar7 % 0x19]);
    glu::StructType::addMember((StructType *)uVar5,"a",&uniform.type);
    glu::VarType::~VarType(&uniform.type);
    uVar5 = rng_1.m_rnd._0_8_;
    dVar7 = deRandom_getUint32(&rng.m_rnd);
    createVarType(&uniform.type,(&DAT_00828fc0)[(ulong)dVar7 % 0x19]);
    glu::StructType::addMember((StructType *)uVar5,"b",&uniform.type);
    glu::VarType::~VarType(&uniform.type);
    uVar5 = rng_1.m_rnd._0_8_;
    dVar7 = deRandom_getUint32(&rng.m_rnd);
    createVarType(&uniform.type,(&DAT_00828fc0)[(ulong)dVar7 % 0x19]);
    glu::StructType::addMember((StructType *)uVar5,"c",&uniform.type);
    glu::VarType::~VarType(&uniform.type);
    uVar5 = rng_1.m_rnd._0_8_;
    dVar7 = deRandom_getUint32(&rng.m_rnd);
    createVarType(&uniform.type,(&DAT_00828fc0)[(ulong)dVar7 % 0x19]);
    glu::StructType::addMember((StructType *)uVar5,"d",&uniform.type);
    glu::VarType::~VarType(&uniform.type);
    uVar5 = rng_1.m_rnd._0_8_;
    dVar7 = deRandom_getUint32(&rng.m_rnd);
    createVarType(&uniform.type,(&DAT_00828fc0)[(ulong)dVar7 % 0x19]);
    glu::StructType::addMember((StructType *)uVar5,"e",&uniform.type);
    glu::VarType::~VarType(&uniform.type);
    config.
    super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::UniformInfo,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::UniformInfo>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    config.
    super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::UniformInfo,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::UniformInfo>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    config.
    super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::UniformInfo,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::UniformInfo>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    glu::VarType::VarType(&local_78,(StructType *)rng_1.m_rnd._0_8_);
    glu::VarType::VarType(&uniform.type,&local_78);
    uniform.declareLocation = (SVar10 | SVar9) & SHADERSTAGE_BOTH;
    uniform.checkLocation = SVar11 & uniform.declareLocation;
    uniform.location = (ShaderStage)local_1d0;
    uniform.layoutLocation = SVar9 & SHADERSTAGE_BOTH;
    std::
    vector<deqp::gles31::Functional::(anonymous_namespace)::UniformInfo,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::UniformInfo>_>
    ::push_back(&config,&uniform);
    glu::VarType::~VarType(&uniform.type);
    glu::VarType::~VarType(&local_78);
    pUVar22 = (UniformLocationCase *)operator_new(0x90);
    anon_unknown_0::UniformLocationCase::UniformLocationCase
              (pUVar22,(this->super_TestCaseGroup).super_TestCaseGroup.super_TestNode.m_testCtx,
               ((this->super_TestCaseGroup).m_context)->m_renderCtx,name._M_dataplus._M_p,
               name._M_dataplus._M_p,&config);
    tcu::TestNode::addChild(pTVar20,(TestNode *)pUVar22);
    std::
    vector<deqp::gles31::Functional::(anonymous_namespace)::UniformInfo,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::UniformInfo>_>
    ::~vector(&config);
    std::__cxx11::string::~string((string *)&name);
    rng_2.m_rnd.x = rng_2.m_rnd.x + 1;
  }
  pTVar20 = (TestNode *)operator_new(0x70);
  tcu::TestCaseGroup::TestCaseGroup
            ((TestCaseGroup *)pTVar20,
             (this->super_TestCaseGroup).super_TestCaseGroup.super_TestNode.m_testCtx,
             "nested_struct","Struct location specified with use, single shader stage");
  deRandom_init(&rng_1.m_rnd,iVar6 + 0x5001);
  tcu::TestNode::addChild((TestNode *)this,pTVar20);
  rng_2.m_rnd.x = 0;
  while( true ) {
    if (0xf < (int)rng_2.m_rnd.x) break;
    de::toString<int>((string *)&uniform,(int *)&rng_2);
    std::operator+(&name,"case_",
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&uniform);
    std::__cxx11::string::~string((string *)&uniform);
    dVar7 = deRandom_getUint32(&rng_1.m_rnd);
    local_238._0_4_ = dVar7 % 0x3c4;
    SVar9 = deRandom_getUint32(&rng_1.m_rnd);
    dVar7 = deRandom_getUint32(&rng_1.m_rnd);
    local_1d0 = (TestNode *)CONCAT44(local_1d0._4_4_,dVar7);
    SVar10 = deRandom_getUint32(&rng_1.m_rnd);
    SVar11 = deRandom_getUint32(&rng_1.m_rnd);
    SVar12 = deRandom_getUint32(&rng_1.m_rnd);
    SVar13 = deRandom_getUint32(&rng_1.m_rnd);
    SVar14 = deRandom_getUint32(&rng_1.m_rnd);
    SVar15 = deRandom_getUint32(&rng_1.m_rnd);
    SVar16 = deRandom_getUint32(&rng_1.m_rnd);
    SVar17 = deRandom_getUint32(&rng_1.m_rnd);
    SVar18 = deRandom_getUint32(&rng_1.m_rnd);
    SVar19 = deRandom_getUint32(&rng_1.m_rnd);
    pSVar24 = (StructType *)operator_new(0x38);
    glu::StructType::StructType(pSVar24,"Type0");
    config.
    super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::UniformInfo,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::UniformInfo>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)pSVar24;
    pSVar24 = (StructType *)operator_new(0x38);
    glu::StructType::StructType(pSVar24,"Type1");
    config.
    super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::UniformInfo,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::UniformInfo>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)pSVar24;
    pSVar24 = (StructType *)operator_new(0x38);
    glu::StructType::StructType(pSVar24,"Type2");
    config.
    super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::UniformInfo,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::UniformInfo>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)pSVar24;
    pSVar24 = (StructType *)operator_new(0x38);
    glu::StructType::StructType(pSVar24,"Type3");
    local_1e0[0] = pSVar24;
    std::vector<glu::StructType_*,_std::allocator<glu::StructType_*>_>::push_back
              (this_00,(value_type *)&config);
    std::vector<glu::StructType_*,_std::allocator<glu::StructType_*>_>::push_back
              (this_00,(value_type *)
                       &config.
                        super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::UniformInfo,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::UniformInfo>_>
                        ._M_impl.super__Vector_impl_data._M_finish);
    std::vector<glu::StructType_*,_std::allocator<glu::StructType_*>_>::push_back
              (this_00,(value_type *)
                       &config.
                        super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::UniformInfo,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::UniformInfo>_>
                        ._M_impl.super__Vector_impl_data._M_end_of_storage);
    std::vector<glu::StructType_*,_std::allocator<glu::StructType_*>_>::push_back(this_00,local_1e0)
    ;
    pUVar25 = config.
              super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::UniformInfo,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::UniformInfo>_>
              ._M_impl.super__Vector_impl_data._M_start;
    dVar7 = deRandom_getUint32(&rng_1.m_rnd);
    createVarType(&uniform.type,(&DAT_00828fc0)[(ulong)dVar7 % 0x19]);
    glu::StructType::addMember((StructType *)pUVar25,"a",&uniform.type);
    glu::VarType::~VarType(&uniform.type);
    pUVar25 = config.
              super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::UniformInfo,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::UniformInfo>_>
              ._M_impl.super__Vector_impl_data._M_start;
    dVar7 = deRandom_getUint32(&rng_1.m_rnd);
    createVarType(&uniform.type,(&DAT_00828fc0)[(ulong)dVar7 % 0x19]);
    glu::StructType::addMember((StructType *)pUVar25,"b",&uniform.type);
    glu::VarType::~VarType(&uniform.type);
    pUVar25 = config.
              super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::UniformInfo,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::UniformInfo>_>
              ._M_impl.super__Vector_impl_data._M_start;
    dVar7 = deRandom_getUint32(&rng_1.m_rnd);
    createVarType(&uniform.type,(&DAT_00828fc0)[(ulong)dVar7 % 0x19]);
    glu::StructType::addMember((StructType *)pUVar25,"c",&uniform.type);
    glu::VarType::~VarType(&uniform.type);
    pUVar25 = config.
              super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::UniformInfo,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::UniformInfo>_>
              ._M_impl.super__Vector_impl_data._M_start;
    dVar7 = deRandom_getUint32(&rng_1.m_rnd);
    createVarType(&uniform.type,(&DAT_00828fc0)[(ulong)dVar7 % 0x19]);
    glu::StructType::addMember((StructType *)pUVar25,"d",&uniform.type);
    glu::VarType::~VarType(&uniform.type);
    pUVar25 = config.
              super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::UniformInfo,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::UniformInfo>_>
              ._M_impl.super__Vector_impl_data._M_start;
    dVar7 = deRandom_getUint32(&rng_1.m_rnd);
    createVarType(&uniform.type,(&DAT_00828fc0)[(ulong)dVar7 % 0x19]);
    glu::StructType::addMember((StructType *)pUVar25,"e",&uniform.type);
    glu::VarType::~VarType(&uniform.type);
    pUVar25 = config.
              super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::UniformInfo,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::UniformInfo>_>
              ._M_impl.super__Vector_impl_data._M_finish;
    dVar7 = deRandom_getUint32(&rng_1.m_rnd);
    createVarType(&uniform.type,(&DAT_00828fc0)[(ulong)dVar7 % 0x19]);
    glu::StructType::addMember((StructType *)pUVar25,"a",&uniform.type);
    glu::VarType::~VarType(&uniform.type);
    pUVar25 = config.
              super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::UniformInfo,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::UniformInfo>_>
              ._M_impl.super__Vector_impl_data._M_finish;
    dVar7 = deRandom_getUint32(&rng_1.m_rnd);
    createVarType(&uniform.type,(&DAT_00828fc0)[(ulong)dVar7 % 0x19]);
    glu::StructType::addMember((StructType *)pUVar25,"b",&uniform.type);
    glu::VarType::~VarType(&uniform.type);
    pUVar25 = config.
              super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::UniformInfo,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::UniformInfo>_>
              ._M_impl.super__Vector_impl_data._M_finish;
    dVar7 = deRandom_getUint32(&rng_1.m_rnd);
    createVarType(&uniform.type,(&DAT_00828fc0)[(ulong)dVar7 % 0x19]);
    glu::StructType::addMember((StructType *)pUVar25,"c",&uniform.type);
    glu::VarType::~VarType(&uniform.type);
    pUVar25 = config.
              super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::UniformInfo,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::UniformInfo>_>
              ._M_impl.super__Vector_impl_data._M_finish;
    dVar7 = deRandom_getUint32(&rng_1.m_rnd);
    createVarType(&uniform.type,(&DAT_00828fc0)[(ulong)dVar7 % 0x19]);
    glu::StructType::addMember((StructType *)pUVar25,"d",&uniform.type);
    glu::VarType::~VarType(&uniform.type);
    pUVar25 = config.
              super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::UniformInfo,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::UniformInfo>_>
              ._M_impl.super__Vector_impl_data._M_finish;
    dVar7 = deRandom_getUint32(&rng_1.m_rnd);
    createVarType(&uniform.type,(&DAT_00828fc0)[(ulong)dVar7 % 0x19]);
    glu::StructType::addMember((StructType *)pUVar25,"e",&uniform.type);
    glu::VarType::~VarType(&uniform.type);
    pUVar25 = config.
              super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::UniformInfo,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::UniformInfo>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage;
    glu::VarType::VarType
              (&uniform.type,
               (StructType *)
               config.
               super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::UniformInfo,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::UniformInfo>_>
               ._M_impl.super__Vector_impl_data._M_start);
    glu::StructType::addMember((StructType *)pUVar25,"a",&uniform.type);
    glu::VarType::~VarType(&uniform.type);
    pUVar25 = config.
              super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::UniformInfo,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::UniformInfo>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage;
    glu::VarType::VarType
              (&uniform.type,
               (StructType *)
               config.
               super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::UniformInfo,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::UniformInfo>_>
               ._M_impl.super__Vector_impl_data._M_finish);
    glu::StructType::addMember((StructType *)pUVar25,"b",&uniform.type);
    glu::VarType::~VarType(&uniform.type);
    pUVar25 = config.
              super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::UniformInfo,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::UniformInfo>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage;
    dVar7 = deRandom_getUint32(&rng_1.m_rnd);
    createVarType(&uniform.type,(&DAT_00828fc0)[(ulong)dVar7 % 0x19]);
    glu::StructType::addMember((StructType *)pUVar25,"c",&uniform.type);
    glu::VarType::~VarType(&uniform.type);
    this_01 = local_1e0[0];
    glu::VarType::VarType
              (&uniform.type,
               (StructType *)
               config.
               super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::UniformInfo,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::UniformInfo>_>
               ._M_impl.super__Vector_impl_data._M_end_of_storage);
    glu::StructType::addMember(this_01,"a",&uniform.type);
    glu::VarType::~VarType(&uniform.type);
    rng.m_rnd.x = 0;
    rng.m_rnd.y = 0;
    rng.m_rnd.z = 0;
    rng.m_rnd.w = 0;
    glu::VarType::VarType
              (&local_90,
               (StructType *)
               config.
               super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::UniformInfo,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::UniformInfo>_>
               ._M_impl.super__Vector_impl_data._M_start);
    glu::VarType::VarType(&uniform.type,&local_90);
    uniform.layoutLocation = SVar9 & SHADERSTAGE_BOTH;
    SVar13 = SVar13 | (ShaderStage)local_1d0;
    SVar14 = SVar14 | SVar10 | SVar15 | SVar11;
    uniform.declareLocation = (SVar12 | SVar9 | SVar13 | SVar14) & SHADERSTAGE_BOTH;
    uniform.checkLocation = SVar16 & uniform.declareLocation;
    uniform.location = -(uint)(uniform.layoutLocation == SHADERSTAGE_NONE) | (uint)local_238;
    std::
    vector<deqp::gles31::Functional::(anonymous_namespace)::UniformInfo,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::UniformInfo>_>
    ::push_back((vector<deqp::gles31::Functional::(anonymous_namespace)::UniformInfo,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::UniformInfo>_>
                 *)&rng,&uniform);
    glu::VarType::~VarType(&uniform.type);
    glu::VarType::~VarType(&local_90);
    glu::VarType::VarType
              (&local_a8,
               (StructType *)
               config.
               super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::UniformInfo,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::UniformInfo>_>
               ._M_impl.super__Vector_impl_data._M_finish);
    glu::VarType::VarType(&uniform.type,&local_a8);
    uniform.layoutLocation = (ShaderStage)local_1d0 & SHADERSTAGE_BOTH;
    uniform.declareLocation = (SVar13 | SVar14) & SHADERSTAGE_BOTH;
    uniform.checkLocation = SVar17 & uniform.declareLocation;
    uniform.location = -(uint)(((ulong)local_1d0 & 3) == 0) | (uint)local_238 + 5;
    std::
    vector<deqp::gles31::Functional::(anonymous_namespace)::UniformInfo,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::UniformInfo>_>
    ::push_back((vector<deqp::gles31::Functional::(anonymous_namespace)::UniformInfo,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::UniformInfo>_>
                 *)&rng,&uniform);
    glu::VarType::~VarType(&uniform.type);
    glu::VarType::~VarType(&local_a8);
    glu::VarType::VarType
              (&local_c0,
               (StructType *)
               config.
               super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::UniformInfo,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::UniformInfo>_>
               ._M_impl.super__Vector_impl_data._M_end_of_storage);
    glu::VarType::VarType(&uniform.type,&local_c0);
    uniform.layoutLocation = SVar10 & SHADERSTAGE_BOTH;
    uniform.declareLocation = SVar14 & SHADERSTAGE_BOTH;
    uniform.checkLocation = SVar18 & uniform.declareLocation;
    uniform.location = -(uint)(uniform.layoutLocation == SHADERSTAGE_NONE) | (uint)local_238 + 0x10;
    std::
    vector<deqp::gles31::Functional::(anonymous_namespace)::UniformInfo,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::UniformInfo>_>
    ::push_back((vector<deqp::gles31::Functional::(anonymous_namespace)::UniformInfo,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::UniformInfo>_>
                 *)&rng,&uniform);
    glu::VarType::~VarType(&uniform.type);
    glu::VarType::~VarType(&local_c0);
    glu::VarType::VarType(&local_d8,local_1e0[0]);
    glu::VarType::VarType(&uniform.type,&local_d8);
    uniform.layoutLocation = SVar11 & SHADERSTAGE_BOTH;
    uniform.declareLocation = (SVar15 | SVar11) & SHADERSTAGE_BOTH;
    uniform.checkLocation = SVar19 & uniform.declareLocation;
    uniform.location = -(uint)(uniform.layoutLocation == SHADERSTAGE_NONE) | (uint)local_238 + 0x1b;
    std::
    vector<deqp::gles31::Functional::(anonymous_namespace)::UniformInfo,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::UniformInfo>_>
    ::push_back((vector<deqp::gles31::Functional::(anonymous_namespace)::UniformInfo,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::UniformInfo>_>
                 *)&rng,&uniform);
    glu::VarType::~VarType(&uniform.type);
    glu::VarType::~VarType(&local_d8);
    pUVar22 = (UniformLocationCase *)operator_new(0x90);
    anon_unknown_0::UniformLocationCase::UniformLocationCase
              (pUVar22,(this->super_TestCaseGroup).super_TestCaseGroup.super_TestNode.m_testCtx,
               ((this->super_TestCaseGroup).m_context)->m_renderCtx,name._M_dataplus._M_p,
               name._M_dataplus._M_p,
               (vector<deqp::gles31::Functional::(anonymous_namespace)::UniformInfo,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::UniformInfo>_>
                *)&rng);
    tcu::TestNode::addChild(pTVar20,(TestNode *)pUVar22);
    std::
    vector<deqp::gles31::Functional::(anonymous_namespace)::UniformInfo,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::UniformInfo>_>
    ::~vector((vector<deqp::gles31::Functional::(anonymous_namespace)::UniformInfo,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::UniformInfo>_>
               *)&rng);
    std::__cxx11::string::~string((string *)&name);
    rng_2.m_rnd.x = rng_2.m_rnd.x + 1;
  }
  pTVar20 = (TestNode *)operator_new(0x70);
  tcu::TestCaseGroup::TestCaseGroup
            ((TestCaseGroup *)pTVar20,
             (this->super_TestCaseGroup).super_TestCaseGroup.super_TestNode.m_testCtx,"min_max",
             "Maximum & minimum location");
  tcu::TestNode::addChild((TestNode *)this,pTVar20);
  for (lVar27 = 0; lVar27 != 0x1c; lVar27 = lVar27 + 1) {
    DVar28 = (&DAT_00828fc0)[lVar27];
    local_1d0 = (TestNode *)&DAT_00a14b00;
    lVar23 = 0;
    while( true ) {
      if (lVar23 == 8) break;
      pcVar21 = glu::getDataTypeName(DVar28);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&config,pcVar21,(allocator<char> *)&rng);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&uniform,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&config,
                     "_");
      std::operator+(&name,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           &uniform,*(char **)local_1d0);
      std::__cxx11::string::~string((string *)&uniform);
      std::__cxx11::string::~string((string *)&config);
      rng.m_rnd.x = 0;
      rng.m_rnd.y = 0;
      rng.m_rnd.z = 0;
      rng.m_rnd.w = 0;
      createVarType(&local_f0,DVar28);
      SVar9 = *(ShaderStage *)(&DAT_008296c8 + lVar23);
      glu::VarType::VarType(&uniform.type,&local_f0);
      uniform.location = 0;
      uniform.declareLocation = SVar9;
      uniform.layoutLocation = SVar9;
      uniform.checkLocation = SVar9;
      std::
      vector<deqp::gles31::Functional::(anonymous_namespace)::UniformInfo,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::UniformInfo>_>
      ::push_back((vector<deqp::gles31::Functional::(anonymous_namespace)::UniformInfo,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::UniformInfo>_>
                   *)&rng,&uniform);
      glu::VarType::~VarType(&uniform.type);
      glu::VarType::~VarType(&local_f0);
      pUVar22 = (UniformLocationCase *)operator_new(0x90);
      pTVar2 = (this->super_TestCaseGroup).super_TestCaseGroup.super_TestNode.m_testCtx;
      pRVar3 = ((this->super_TestCaseGroup).m_context)->m_renderCtx;
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&uniform,
                     &name,"_min");
      uVar5 = uniform.type._0_8_;
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&config,
                     &name,"_min");
      anon_unknown_0::UniformLocationCase::UniformLocationCase
                (pUVar22,pTVar2,pRVar3,(char *)uVar5,
                 (char *)config.
                         super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::UniformInfo,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::UniformInfo>_>
                         ._M_impl.super__Vector_impl_data._M_start,
                 (vector<deqp::gles31::Functional::(anonymous_namespace)::UniformInfo,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::UniformInfo>_>
                  *)&rng);
      tcu::TestNode::addChild(pTVar20,(TestNode *)pUVar22);
      std::__cxx11::string::~string((string *)&config);
      std::__cxx11::string::~string((string *)&uniform);
      pUVar22 = (UniformLocationCase *)operator_new(0x90);
      pTVar2 = (this->super_TestCaseGroup).super_TestCaseGroup.super_TestNode.m_testCtx;
      pRVar3 = ((this->super_TestCaseGroup).m_context)->m_renderCtx;
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&uniform,
                     &name,"_max");
      uVar5 = uniform.type._0_8_;
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&config,
                     &name,"_max");
      anon_unknown_0::UniformLocationCase::UniformLocationCase
                (pUVar22,pTVar2,pRVar3,(char *)uVar5,
                 (char *)config.
                         super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::UniformInfo,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::UniformInfo>_>
                         ._M_impl.super__Vector_impl_data._M_start,
                 (vector<deqp::gles31::Functional::(anonymous_namespace)::UniformInfo,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::UniformInfo>_>
                  *)&rng);
      (pUVar22->super_TestCase).super_TestNode._vptr_TestNode =
           (_func_int **)&PTR__UniformLocationCase_00a14b88;
      tcu::TestNode::addChild(pTVar20,(TestNode *)pUVar22);
      std::__cxx11::string::~string((string *)&config);
      std::__cxx11::string::~string((string *)&uniform);
      std::
      vector<deqp::gles31::Functional::(anonymous_namespace)::UniformInfo,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::UniformInfo>_>
      ::~vector((vector<deqp::gles31::Functional::(anonymous_namespace)::UniformInfo,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::UniformInfo>_>
                 *)&rng);
      std::__cxx11::string::~string((string *)&name);
      lVar23 = lVar23 + 4;
      local_1d0 = (TestNode *)((long)local_1d0 + 8);
    }
  }
  pTVar20 = (TestNode *)operator_new(0x70);
  tcu::TestCaseGroup::TestCaseGroup
            ((TestCaseGroup *)pTVar20,
             (this->super_TestCaseGroup).super_TestCaseGroup.super_TestNode.m_testCtx,"link",
             "Location specified independently from use");
  deRandom_init(&rng_1.m_rnd,iVar6 + 0x82e1);
  tcu::TestNode::addChild((TestNode *)this,pTVar20);
  local_1d0 = pTVar20;
  for (rng_2.m_rnd.x = 0; (int)rng_2.m_rnd.x < 10; rng_2.m_rnd.x = rng_2.m_rnd.x + 1) {
    de::toString<int>((string *)&uniform,(int *)&rng_2);
    std::operator+(&name,"case_",
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&uniform);
    std::__cxx11::string::~string((string *)&uniform);
    dVar7 = rng_2.m_rnd.x;
    config.
    super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::UniformInfo,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::UniformInfo>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    config.
    super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::UniformInfo,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::UniformInfo>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    config.
    super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::UniformInfo,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::UniformInfo>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    std::vector<int,_std::allocator<int>_>::vector
              ((vector<int,_std::allocator<int>_> *)&rng,0x400,(allocator_type *)&uniform);
    deRandom_init((deRandom *)&uniform,dVar7 * 100 + 0x1234);
    for (lVar27 = 0; lVar27 != 0x400; lVar27 = lVar27 + 1) {
      *(int *)(rng.m_rnd._0_8_ + lVar27 * 4) = (int)lVar27;
    }
    de::Random::shuffle<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>>
              ((Random *)&uniform,
               (__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>)rng.m_rnd._0_8_,
               (__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>)rng.m_rnd._8_8_);
    iVar6 = 0x20;
    while( true ) {
      bVar30 = iVar6 == 0;
      iVar6 = iVar6 + -1;
      if (bVar30) break;
      SVar9 = deRandom_getUint32(&rng_1.m_rnd);
      SVar10 = deRandom_getUint32(&rng_1.m_rnd);
      SVar11 = deRandom_getUint32(&rng_1.m_rnd);
      dVar7 = deRandom_getUint32(&rng_1.m_rnd);
      createVarType(&local_108,(&DAT_00828fc0)[(ulong)dVar7 % 0x19]);
      iVar29 = -1;
      if ((SVar9 & SHADERSTAGE_BOTH) != SHADERSTAGE_NONE) {
        iVar29 = *(int *)(rng.m_rnd._8_8_ + -4);
      }
      glu::VarType::VarType(&uniform.type,&local_108);
      uniform.declareLocation = (SVar10 | SVar9) & SHADERSTAGE_BOTH;
      uniform.checkLocation = SVar11 & uniform.declareLocation;
      uniform.layoutLocation = SVar9 & SHADERSTAGE_BOTH;
      uniform.location = iVar29;
      glu::VarType::~VarType(&local_108);
      std::
      vector<deqp::gles31::Functional::(anonymous_namespace)::UniformInfo,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::UniformInfo>_>
      ::push_back(&config,&uniform);
      rng.m_rnd._8_8_ = rng.m_rnd._8_8_ + -4;
      glu::VarType::~VarType(&uniform.type);
      pTVar20 = local_1d0;
    }
    pUVar22 = (UniformLocationCase *)operator_new(0x90);
    anon_unknown_0::UniformLocationCase::UniformLocationCase
              (pUVar22,(this->super_TestCaseGroup).super_TestCaseGroup.super_TestNode.m_testCtx,
               ((this->super_TestCaseGroup).m_context)->m_renderCtx,name._M_dataplus._M_p,
               name._M_dataplus._M_p,&config);
    tcu::TestNode::addChild(pTVar20,(TestNode *)pUVar22);
    std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
              ((_Vector_base<int,_std::allocator<int>_> *)&rng);
    std::
    vector<deqp::gles31::Functional::(anonymous_namespace)::UniformInfo,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::UniformInfo>_>
    ::~vector(&config);
    std::__cxx11::string::~string((string *)&name);
  }
  pUVar25 = (pointer)operator_new(0x70);
  tcu::TestCaseGroup::TestCaseGroup
            ((TestCaseGroup *)pUVar25,
             (this->super_TestCaseGroup).super_TestCaseGroup.super_TestNode.m_testCtx,"negative",
             "Negative tests");
  config.
  super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::UniformInfo,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::UniformInfo>_>
  ._M_impl.super__Vector_impl_data._M_start = pUVar25;
  pTVar26 = (TestCaseGroup *)operator_new(0x70);
  tcu::TestCaseGroup::TestCaseGroup
            (pTVar26,(this->super_TestCaseGroup).super_TestCaseGroup.super_TestNode.m_testCtx,"es31"
             ,"GLSL ES 3.1 Negative tests");
  pCVar4 = (this->super_TestCaseGroup).m_context;
  rng.m_rnd._0_8_ = pTVar26;
  gls::ShaderLibrary::ShaderLibrary
            ((ShaderLibrary *)&uniform,
             (this->super_TestCaseGroup).super_TestCaseGroup.super_TestNode.m_testCtx,
             pCVar4->m_renderCtx,pCVar4->m_contextInfo);
  gls::ShaderLibrary::loadShaderFile
            ((vector<tcu::TestNode_*,_std::allocator<tcu::TestNode_*>_> *)&name,
             (ShaderLibrary *)&uniform,"shaders/es31/uniform_location.test");
  for (lVar27 = 0; uVar5 = rng.m_rnd._0_8_,
      lVar27 < (int)(name._M_string_length - (long)name._M_dataplus._M_p >> 3); lVar27 = lVar27 + 1)
  {
    tcu::TestNode::addChild
              ((TestNode *)rng.m_rnd._0_8_,*(TestNode **)(name._M_dataplus._M_p + lVar27 * 8));
  }
  rng.m_rnd.x = 0;
  rng.m_rnd.y = 0;
  tcu::TestNode::addChild
            ((TestNode *)
             config.
             super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::UniformInfo,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::UniformInfo>_>
             ._M_impl.super__Vector_impl_data._M_start,(TestNode *)uVar5);
  std::_Vector_base<tcu::TestNode_*,_std::allocator<tcu::TestNode_*>_>::~_Vector_base
            ((_Vector_base<tcu::TestNode_*,_std::allocator<tcu::TestNode_*>_> *)&name);
  gls::ShaderLibrary::~ShaderLibrary((ShaderLibrary *)&uniform);
  de::details::UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>::~UniqueBase
            ((UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_> *)&rng);
  pTVar26 = (TestCaseGroup *)operator_new(0x70);
  tcu::TestCaseGroup::TestCaseGroup
            (pTVar26,(this->super_TestCaseGroup).super_TestCaseGroup.super_TestNode.m_testCtx,"es32"
             ,"GLSL ES 3.2 Negative tests");
  pCVar4 = (this->super_TestCaseGroup).m_context;
  rng.m_rnd._0_8_ = pTVar26;
  gls::ShaderLibrary::ShaderLibrary
            ((ShaderLibrary *)&uniform,
             (this->super_TestCaseGroup).super_TestCaseGroup.super_TestNode.m_testCtx,
             pCVar4->m_renderCtx,pCVar4->m_contextInfo);
  gls::ShaderLibrary::loadShaderFile
            ((vector<tcu::TestNode_*,_std::allocator<tcu::TestNode_*>_> *)&name,
             (ShaderLibrary *)&uniform,"shaders/es32/uniform_location.test");
  for (lVar27 = 0; uVar5 = rng.m_rnd._0_8_,
      lVar27 < (int)(name._M_string_length - (long)name._M_dataplus._M_p >> 3); lVar27 = lVar27 + 1)
  {
    tcu::TestNode::addChild
              ((TestNode *)rng.m_rnd._0_8_,*(TestNode **)(name._M_dataplus._M_p + lVar27 * 8));
  }
  rng.m_rnd.x = 0;
  rng.m_rnd.y = 0;
  tcu::TestNode::addChild
            ((TestNode *)
             config.
             super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::UniformInfo,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::UniformInfo>_>
             ._M_impl.super__Vector_impl_data._M_start,(TestNode *)uVar5);
  std::_Vector_base<tcu::TestNode_*,_std::allocator<tcu::TestNode_*>_>::~_Vector_base
            ((_Vector_base<tcu::TestNode_*,_std::allocator<tcu::TestNode_*>_> *)&name);
  gls::ShaderLibrary::~ShaderLibrary((ShaderLibrary *)&uniform);
  de::details::UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>::~UniqueBase
            ((UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_> *)&rng);
  pUVar25 = config.
            super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::UniformInfo,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::UniformInfo>_>
            ._M_impl.super__Vector_impl_data._M_start;
  config.
  super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::UniformInfo,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::UniformInfo>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)pUVar25);
  de::details::UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>::~UniqueBase
            ((UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_> *)&config);
  return extraout_EAX;
}

Assistant:

void UniformLocationTests::init (void)
{
	using namespace glu;

	const UniformInfo::ShaderStage checkStages[]	= { UniformInfo::SHADERSTAGE_VERTEX, UniformInfo::SHADERSTAGE_FRAGMENT };
	const char*						stageNames[]	= {"vertex", "fragment"};
	const int						maxLocations	= 1024;
	const int						baseSeed		= m_context.getTestContext().getCommandLine().getBaseSeed();

	const DataType					primitiveTypes[] =
	{
		TYPE_FLOAT,
		TYPE_FLOAT_VEC2,
		TYPE_FLOAT_VEC3,
		TYPE_FLOAT_VEC4,

		TYPE_INT,
		TYPE_INT_VEC2,
		TYPE_INT_VEC3,
		TYPE_INT_VEC4,

		TYPE_UINT,
		TYPE_UINT_VEC2,
		TYPE_UINT_VEC3,
		TYPE_UINT_VEC4,

		TYPE_BOOL,
		TYPE_BOOL_VEC2,
		TYPE_BOOL_VEC3,
		TYPE_BOOL_VEC4,

		TYPE_FLOAT_MAT2,
		TYPE_FLOAT_MAT2X3,
		TYPE_FLOAT_MAT2X4,
		TYPE_FLOAT_MAT3X2,
		TYPE_FLOAT_MAT3,
		TYPE_FLOAT_MAT3X4,
		TYPE_FLOAT_MAT4X2,
		TYPE_FLOAT_MAT4X3,
		TYPE_FLOAT_MAT4,

		TYPE_SAMPLER_2D,
		TYPE_INT_SAMPLER_2D,
		TYPE_UINT_SAMPLER_2D,
	};

	const int maxPrimitiveTypeNdx = DE_LENGTH_OF_ARRAY(primitiveTypes) - 4;
	DE_ASSERT(primitiveTypes[maxPrimitiveTypeNdx] == TYPE_FLOAT_MAT4);

	// Primitive type cases with trivial linkage
	{
		tcu::TestCaseGroup* const	group	= new tcu::TestCaseGroup(m_testCtx, "basic", "Location specified with use, single shader stage");
		de::Random					rng		(baseSeed + 0x1001);
		addChild(group);

		for (int primitiveNdx = 0; primitiveNdx < DE_LENGTH_OF_ARRAY(primitiveTypes); primitiveNdx++)
		{
			const DataType		type	= primitiveTypes[primitiveNdx];

			for (int stageNdx = 0; stageNdx < DE_LENGTH_OF_ARRAY(checkStages); stageNdx++)
			{
				const string		name		= string(getDataTypeName(type)) + "_" + stageNames[stageNdx];

				vector<UniformInfo> config;

				UniformInfo			uniform	(createVarType(type),
											 checkStages[stageNdx],
											 checkStages[stageNdx],
											 checkStages[stageNdx],
											 rng.getInt(0, maxLocations-1));

				config.push_back(uniform);
				group->addChild(new UniformLocationCase (m_testCtx, m_context.getRenderContext(), name.c_str(), name.c_str(), config));
			}
		}
	}

	// Arrays
	{
		tcu::TestCaseGroup* const	group	= new tcu::TestCaseGroup(m_testCtx, "array", "Array location specified with use, single shader stage");
		de::Random					rng		(baseSeed + 0x2001);
		addChild(group);

		for (int primitiveNdx = 0; primitiveNdx < DE_LENGTH_OF_ARRAY(primitiveTypes); primitiveNdx++)
		{
			const DataType		type	= primitiveTypes[primitiveNdx];

			for (int stageNdx = 0; stageNdx < DE_LENGTH_OF_ARRAY(checkStages); stageNdx++)
			{

				const string		name	= string(getDataTypeName(type)) + "_" + stageNames[stageNdx];

				vector<UniformInfo> config;

				UniformInfo			uniform	(VarType(createVarType(type), 8),
												checkStages[stageNdx],
												checkStages[stageNdx],
												checkStages[stageNdx],
												rng.getInt(0, maxLocations-1-8));

				config.push_back(uniform);
				group->addChild(new UniformLocationCase (m_testCtx, m_context.getRenderContext(), name.c_str(), name.c_str(), config));
			}
		}
	}

	// Nested Arrays
	{
		tcu::TestCaseGroup* const	group	= new tcu::TestCaseGroup(m_testCtx, "nested_array", "Array location specified with use, single shader stage");
		de::Random					rng		(baseSeed + 0x3001);
		addChild(group);

		for (int primitiveNdx = 0; primitiveNdx < DE_LENGTH_OF_ARRAY(primitiveTypes); primitiveNdx++)
		{
			const DataType		type	= primitiveTypes[primitiveNdx];

			for (int stageNdx = 0; stageNdx < DE_LENGTH_OF_ARRAY(checkStages); stageNdx++)
			{
				const string		name		= string(getDataTypeName(type)) + "_" + stageNames[stageNdx];
				// stay comfortably within minimum max uniform component count (896 in fragment) and sampler count with all types
				const int			arraySize	= (getDataTypeScalarSize(type) > 4 || isDataTypeSampler(type)) ? 3 : 7;

				vector<UniformInfo> config;

				UniformInfo			uniform	(VarType(VarType(createVarType(type), arraySize), arraySize),
											 checkStages[stageNdx],
											 checkStages[stageNdx],
											 checkStages[stageNdx],
											 rng.getInt(0, maxLocations-1-arraySize*arraySize));

				config.push_back(uniform);
				group->addChild(new UniformLocationCase (m_testCtx, m_context.getRenderContext(), name.c_str(), name.c_str(), config));
			}
		}
	}

	// Structs
	{
		tcu::TestCaseGroup* const	group	= new tcu::TestCaseGroup(m_testCtx, "struct", "Struct location, random contents & declaration location");
		de::Random					rng		(baseSeed + 0x4001);
		addChild(group);

		for (int caseNdx = 0; caseNdx < 16; caseNdx++)
		{
			typedef UniformInfo::ShaderStage Stage;

			const string	name		= "case_" + de::toString(caseNdx);

			const Stage		layoutLoc	= Stage(rng.getUint32()&0x3);
			const Stage		declareLoc	= Stage((rng.getUint32()&0x3) | layoutLoc);
			const Stage		verifyLoc	= Stage((rng.getUint32()&0x3) & declareLoc);
			const int		location	= layoutLoc ? rng.getInt(0, maxLocations-1-5) : -1;

			StructType*		structProto = new StructType("S");

			structTypes.push_back(structProto);

			structProto->addMember("a", createVarType(primitiveTypes[rng.getInt(0, maxPrimitiveTypeNdx)]));
			structProto->addMember("b", createVarType(primitiveTypes[rng.getInt(0, maxPrimitiveTypeNdx)]));
			structProto->addMember("c", createVarType(primitiveTypes[rng.getInt(0, maxPrimitiveTypeNdx)]));
			structProto->addMember("d", createVarType(primitiveTypes[rng.getInt(0, maxPrimitiveTypeNdx)]));
			structProto->addMember("e", createVarType(primitiveTypes[rng.getInt(0, maxPrimitiveTypeNdx)]));

			{
				vector<UniformInfo> config;

				config.push_back(UniformInfo(VarType(structProto),
											 declareLoc,
											 layoutLoc,
											 verifyLoc,
											 location));
				group->addChild(new UniformLocationCase (m_testCtx, m_context.getRenderContext(), name.c_str(), name.c_str(), config));
			}
		}
	}

	// Nested Structs
	{
		tcu::TestCaseGroup* const	group	= new tcu::TestCaseGroup(m_testCtx, "nested_struct", "Struct location specified with use, single shader stage");
		de::Random					rng		(baseSeed + 0x5001);

		addChild(group);

		for (int caseNdx = 0; caseNdx < 16; caseNdx++)
		{
			typedef UniformInfo::ShaderStage Stage;

			const string	name		= "case_" + de::toString(caseNdx);
			const int		baseLoc		= rng.getInt(0, maxLocations-1-60);

			// Structs need to be added in the order of their declaration
			const Stage		layoutLocs[]=
			{
				Stage(rng.getUint32()&0x3),
				Stage(rng.getUint32()&0x3),
				Stage(rng.getUint32()&0x3),
				Stage(rng.getUint32()&0x3),
			};

			const deUint32	tempDecl[] =
			{
				(rng.getUint32()&0x3) | layoutLocs[0],
				(rng.getUint32()&0x3) | layoutLocs[1],
				(rng.getUint32()&0x3) | layoutLocs[2],
				(rng.getUint32()&0x3) | layoutLocs[3],
			};

			// Component structs need to be declared if anything using them is declared
			const Stage		declareLocs[] =
			{
				Stage(tempDecl[0] | tempDecl[1] | tempDecl[2] | tempDecl[3]),
				Stage(tempDecl[1] | tempDecl[2] | tempDecl[3]),
				Stage(tempDecl[2] | tempDecl[3]),
				Stage(tempDecl[3]),
			};

			const Stage		verifyLocs[] =
			{
				Stage(rng.getUint32()&0x3 & declareLocs[0]),
				Stage(rng.getUint32()&0x3 & declareLocs[1]),
				Stage(rng.getUint32()&0x3 & declareLocs[2]),
				Stage(rng.getUint32()&0x3 & declareLocs[3]),
			};

			StructType*		testTypes[]	=
			{
				new StructType("Type0"),
				new StructType("Type1"),
				new StructType("Type2"),
				new StructType("Type3"),
			};

			structTypes.push_back(testTypes[0]);
			structTypes.push_back(testTypes[1]);
			structTypes.push_back(testTypes[2]);
			structTypes.push_back(testTypes[3]);

			testTypes[0]->addMember("a", createVarType(primitiveTypes[rng.getInt(0, maxPrimitiveTypeNdx)]));
			testTypes[0]->addMember("b", createVarType(primitiveTypes[rng.getInt(0, maxPrimitiveTypeNdx)]));
			testTypes[0]->addMember("c", createVarType(primitiveTypes[rng.getInt(0, maxPrimitiveTypeNdx)]));
			testTypes[0]->addMember("d", createVarType(primitiveTypes[rng.getInt(0, maxPrimitiveTypeNdx)]));
			testTypes[0]->addMember("e", createVarType(primitiveTypes[rng.getInt(0, maxPrimitiveTypeNdx)]));

			testTypes[1]->addMember("a", createVarType(primitiveTypes[rng.getInt(0, maxPrimitiveTypeNdx)]));
			testTypes[1]->addMember("b", createVarType(primitiveTypes[rng.getInt(0, maxPrimitiveTypeNdx)]));
			testTypes[1]->addMember("c", createVarType(primitiveTypes[rng.getInt(0, maxPrimitiveTypeNdx)]));
			testTypes[1]->addMember("d", createVarType(primitiveTypes[rng.getInt(0, maxPrimitiveTypeNdx)]));
			testTypes[1]->addMember("e", createVarType(primitiveTypes[rng.getInt(0, maxPrimitiveTypeNdx)]));

			testTypes[2]->addMember("a", VarType(testTypes[0]));
			testTypes[2]->addMember("b", VarType(testTypes[1]));
			testTypes[2]->addMember("c", createVarType(primitiveTypes[rng.getInt(0, maxPrimitiveTypeNdx)]));

			testTypes[3]->addMember("a", VarType(testTypes[2]));

			{
				vector<UniformInfo> config;

				config.push_back(UniformInfo(VarType(testTypes[0]),
											 declareLocs[0],
											 layoutLocs[0],
											 verifyLocs[0],
											 layoutLocs[0] ? baseLoc : -1));

				config.push_back(UniformInfo(VarType(testTypes[1]),
											 declareLocs[1],
											 layoutLocs[1],
											 verifyLocs[1],
											 layoutLocs[1] ? baseLoc+5 : -1));

				config.push_back(UniformInfo(VarType(testTypes[2]),
											 declareLocs[2],
											 layoutLocs[2],
											 verifyLocs[2],
											 layoutLocs[2] ? baseLoc+16 : -1));

				config.push_back(UniformInfo(VarType(testTypes[3]),
											 declareLocs[3],
											 layoutLocs[3],
											 verifyLocs[3],
											 layoutLocs[3] ? baseLoc+27 : -1));

				group->addChild(new UniformLocationCase (m_testCtx, m_context.getRenderContext(), name.c_str(), name.c_str(), config));
			}
		}
	}

	// Min/Max location
	{
		tcu::TestCaseGroup* const	group		= new tcu::TestCaseGroup(m_testCtx, "min_max", "Maximum & minimum location");

		addChild(group);

		for (int primitiveNdx = 0; primitiveNdx < DE_LENGTH_OF_ARRAY(primitiveTypes); primitiveNdx++)
		{
			const DataType		type	= primitiveTypes[primitiveNdx];

			for (int stageNdx = 0; stageNdx < DE_LENGTH_OF_ARRAY(checkStages); stageNdx++)
			{
				const string		name		= string(getDataTypeName(type)) + "_" + stageNames[stageNdx];
				vector<UniformInfo> config;

				config.push_back(UniformInfo(createVarType(type),
											 checkStages[stageNdx],
											 checkStages[stageNdx],
											 checkStages[stageNdx],
											 0));

				group->addChild(new UniformLocationCase (m_testCtx, m_context.getRenderContext(), (name+"_min").c_str(), (name+"_min").c_str(), config));

				group->addChild(new MaxUniformLocationCase (m_testCtx, m_context.getRenderContext(), (name+"_max").c_str(), (name+"_max").c_str(), config));
			}
		}
	}

	// Link
	{
		tcu::TestCaseGroup* const	group	= new tcu::TestCaseGroup(m_testCtx, "link", "Location specified independently from use");
		de::Random					rng		(baseSeed + 0x82e1);

		addChild(group);

		for (int caseNdx = 0; caseNdx < 10; caseNdx++)
		{
			const string		name		= "case_" + de::toString(caseNdx);
			vector<UniformInfo> config;

			vector<int>			locations	= shuffledRange(0, maxLocations, 0x1234 + caseNdx*100);

			for (int count = 0; count < 32; count++)
			{
				typedef UniformInfo::ShaderStage Stage;

				const Stage			layoutLoc	= Stage(rng.getUint32()&0x3);
				const Stage			declareLoc	= Stage((rng.getUint32()&0x3) | layoutLoc);
				const Stage			verifyLoc	= Stage((rng.getUint32()&0x3) & declareLoc);

				const UniformInfo	uniform		(createVarType(primitiveTypes[rng.getInt(0, maxPrimitiveTypeNdx)]),
												 declareLoc,
												 layoutLoc,
												 verifyLoc,
												 (layoutLoc!=0) ? locations.back() : -1);

				config.push_back(uniform);
				locations.pop_back();
			}
			group->addChild(new UniformLocationCase (m_testCtx, m_context.getRenderContext(), name.c_str(), name.c_str(), config));
		}
	}

	// Negative
	{
		de::MovePtr<tcu::TestCaseGroup>	negativeGroup			(new tcu::TestCaseGroup(m_testCtx, "negative", "Negative tests"));

		{
			de::MovePtr<tcu::TestCaseGroup>	es31Group		(new tcu::TestCaseGroup(m_testCtx, "es31", "GLSL ES 3.1 Negative tests"));
			gls::ShaderLibrary				shaderLibrary   (m_testCtx, m_context.getRenderContext(), m_context.getContextInfo());
			const vector<TestNode*>			negativeCases    = shaderLibrary.loadShaderFile("shaders/es31/uniform_location.test");

			for (int ndx = 0; ndx < int(negativeCases.size()); ndx++)
				es31Group->addChild(negativeCases[ndx]);

			negativeGroup->addChild(es31Group.release());
		}

		{
			de::MovePtr<tcu::TestCaseGroup>	es32Group		(new tcu::TestCaseGroup(m_testCtx, "es32", "GLSL ES 3.2 Negative tests"));
			gls::ShaderLibrary				shaderLibrary   (m_testCtx, m_context.getRenderContext(), m_context.getContextInfo());
			const vector<TestNode*>			negativeCases    = shaderLibrary.loadShaderFile("shaders/es32/uniform_location.test");

			for (int ndx = 0; ndx < int(negativeCases.size()); ndx++)
				es32Group->addChild(negativeCases[ndx]);

			negativeGroup->addChild(es32Group.release());
		}

		addChild(negativeGroup.release());
	}
}